

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfid.cpp
# Opt level: O0

void checkOptions(Options *opts,int argc,char **argv)

{
  Options *pOVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_4a8;
  allocator local_481;
  string local_480;
  allocator local_459;
  string local_458;
  allocator local_431;
  string local_430;
  allocator local_409;
  string local_408;
  allocator local_3e1;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  allocator local_321;
  string local_320;
  allocator local_2f9;
  string local_2f8;
  allocator local_2d1;
  string local_2d0;
  allocator local_2a9;
  string local_2a8;
  allocator local_281;
  string local_280;
  allocator local_259;
  string local_258;
  allocator local_231;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  allocator local_169;
  string local_168;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  allocator local_f1;
  string local_f0;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  char **local_20;
  char **argv_local;
  Options *pOStack_10;
  int argc_local;
  Options *opts_local;
  
  local_20 = argv;
  argv_local._4_4_ = argc;
  pOStack_10 = opts;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"author=b",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"author of program",&local_79);
  smf::Options::define(opts,&local_40,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"version=b",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"compilation info",&local_c9);
  smf::Options::define(pOVar1,&local_a0,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f0,"example=b",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,"example usages",&local_119);
  smf::Options::define(pOVar1,&local_f0,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_140,"h|help=b",&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_168,"short description",&local_169);
  smf::Options::define(pOVar1,&local_140,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"t|track=i:-1",&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1b8,"which track to extract",&local_1b9);
  smf::Options::define(pOVar1,&local_190,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,"r|raw=b",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"print noteon deltas",&local_209);
  smf::Options::define(pOVar1,&local_1e0,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"f|file=b",&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"display filename",&local_259);
  smf::Options::define(pOVar1,&local_230,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"max=i:100000",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2a8,"maximum number of notes expected in input",&local_2a9);
  smf::Options::define(pOVar1,&local_280,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d0,"debug=b",&local_2d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f8,"debug mode to find errors in input file",&local_2f9);
  smf::Options::define(pOVar1,&local_2d0,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  smf::Options::process(pOStack_10,argv_local._4_4_,local_20,1,0);
  pOVar1 = pOStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"author",&local_321);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  pOVar1 = pOStack_10;
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    poVar4 = std::operator<<(poVar4,"craig@ccrma.stanford.edu, 18 Jun 2002");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"version",&local_349);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  pOVar1 = pOStack_10;
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,*local_20);
    poVar4 = std::operator<<(poVar4,", version: 18 Jun 2002");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"compiled: ");
    poVar4 = std::operator<<(poVar4,"Apr 26 2025");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"help",&local_371);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  pOVar1 = pOStack_10;
  if (bVar2) {
    smf::Options::getCommand_abi_cxx11_(&local_398,pOStack_10);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    usage(pcVar5);
    std::__cxx11::string::~string((string *)&local_398);
    exit(0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b8,"example",&local_3b9);
  bVar2 = smf::Options::getBoolean(pOVar1,&local_3b8);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  pOVar1 = pOStack_10;
  if (!bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e0,"track",&local_3e1);
    track = smf::Options::getInteger(pOVar1,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
    pOVar1 = pOStack_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,"debug",&local_409);
    bVar2 = smf::Options::getBoolean(pOVar1,&local_408);
    debugQ = (int)bVar2;
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_409);
    pOVar1 = pOStack_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_430,"max",&local_431);
    maxcount = smf::Options::getInteger(pOVar1,&local_430);
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    pOVar1 = pOStack_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_458,"raw",&local_459);
    bVar2 = smf::Options::getBoolean(pOVar1,&local_458);
    rawQ = (int)bVar2;
    std::__cxx11::string::~string((string *)&local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    pOVar1 = pOStack_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_480,"file",&local_481);
    bVar2 = smf::Options::getBoolean(pOVar1,&local_480);
    fileQ = (int)bVar2;
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator((allocator<char> *)&local_481);
    iVar3 = smf::Options::getArgCount(pOStack_10);
    if (iVar3 != 1) {
      smf::Options::getCommand_abi_cxx11_(&local_4a8,pOStack_10);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      usage(pcVar5);
      std::__cxx11::string::~string((string *)&local_4a8);
      exit(1);
    }
    return;
  }
  example();
  exit(0);
}

Assistant:

void checkOptions(Options& opts, int argc, char* argv[]) {
	opts.define("author=b",  "author of program");
	opts.define("version=b", "compilation info");
	opts.define("example=b", "example usages");
	opts.define("h|help=b",  "short description");

	opts.define("t|track=i:-1", "which track to extract");
	opts.define("r|raw=b",      "print noteon deltas");
	opts.define("f|file=b",      "display filename");
	opts.define("max=i:100000", "maximum number of notes expected in input");
	opts.define("debug=b",  "debug mode to find errors in input file");

	opts.process(argc, argv);

	// handle basic options:
	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
			  << "craig@ccrma.stanford.edu, 18 Jun 2002" << endl;
		exit(0);
	} else if (opts.getBoolean("version")) {
		cout << argv[0] << ", version: 18 Jun 2002" << endl;
		cout << "compiled: " << __DATE__ << endl;
		exit(0);
	} else if (opts.getBoolean("help")) {
		usage(opts.getCommand().c_str());
		exit(0);
	} else if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	track    = opts.getInteger("track");
	debugQ   = opts.getBoolean("debug");
	maxcount = opts.getInteger("max");
	rawQ     = opts.getBoolean("raw");
	fileQ    = opts.getBoolean("file");

	if (opts.getArgCount() != 1) {
		usage(opts.getCommand().c_str());
		exit(1);
	}
}